

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

ssize_t __thiscall sockpp::stream_socket::write(stream_socket *this,int __fd,void *__buf,size_t __n)

{
  socket_t __fd_00;
  iovec *__iovec;
  size_type sVar1;
  socket *this_00;
  long ret;
  undefined4 in_register_00000034;
  vector<iovec,_std::allocator<iovec>_> *ranges_local;
  stream_socket *this_local;
  
  __fd_00 = socket::handle((socket *)CONCAT44(in_register_00000034,__fd));
  __iovec = std::vector<iovec,_std::allocator<iovec>_>::data
                      ((vector<iovec,_std::allocator<iovec>_> *)__buf);
  sVar1 = std::vector<iovec,_std::allocator<iovec>_>::size
                    ((vector<iovec,_std::allocator<iovec>_> *)__buf);
  this_00 = (socket *)writev(__fd_00,(iovec *)__iovec,(int)sVar1);
  socket::check_res<long,unsigned_long>((result<unsigned_long> *)this,this_00,ret);
  return (ssize_t)this;
}

Assistant:

result<size_t> stream_socket::write(const std::vector<iovec>& ranges) {
#if !defined(_WIN32)
    return check_res<ssize_t, size_t>(::writev(handle(), ranges.data(), int(ranges.size())));
#else
    std::vector<WSABUF> bufs;
    for (const auto& iovec : ranges) {
        bufs.push_back({static_cast<ULONG>(iovec.iov_len), static_cast<CHAR*>(iovec.iov_base)}
        );
    }

    DWORD nwritten = 0, nmsg = DWORD(bufs.size());

    if (::WSASend(handle(), bufs.data(), nmsg, &nwritten, 0, nullptr, nullptr) ==
        SOCKET_ERROR)
        return result<size_t>::from_last_error();
    return size_t(nwritten);
#endif
}